

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableRead.cpp
# Opt level: O0

string * __thiscall
ninx::parser::element::VariableRead::dump_abi_cxx11_
          (string *__return_storage_ptr__,VariableRead *this,int level)

{
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  VariableRead *pVStack_18;
  int level_local;
  VariableRead *this_local;
  
  local_1c = level;
  pVStack_18 = this;
  this_local = (VariableRead *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,(long)level,'\t',&local_61);
  std::operator+(&local_40,&local_60,"VariableRead: ");
  std::operator+(__return_storage_ptr__,&local_40,&this->name);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::VariableRead::dump(int level) const {
    return std::string(level, '\t')+"VariableRead: "+name;
}